

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

DdNode * Llb_NonlinCreateCube2(Llb_Mgr_t *p,Llb_Prt_t *pPart1,Llb_Prt_t *pPart2)

{
  abctime aVar1;
  DdManager *dd;
  int iVar2;
  Llb_Var_t *pLVar3;
  DdNode *pDVar4;
  abctime TimeStop;
  int i;
  Llb_Var_t *pVar;
  DdNode *bTemp;
  DdNode *bCube;
  Llb_Prt_t *pPart2_local;
  Llb_Prt_t *pPart1_local;
  Llb_Mgr_t *p_local;
  
  aVar1 = p->dd->TimeStop;
  p->dd->TimeStop = 0;
  bTemp = Cudd_ReadOne(p->dd);
  Cudd_Ref(bTemp);
  TimeStop._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pPart1->vVars);
    if (iVar2 <= TimeStop._4_4_) {
      Cudd_Deref(bTemp);
      p->dd->TimeStop = aVar1;
      return bTemp;
    }
    iVar2 = Vec_IntEntry(pPart1->vVars,TimeStop._4_4_);
    pLVar3 = Llb_MgrVar(p,iVar2);
    iVar2 = Vec_IntSize(pLVar3->vParts);
    if (iVar2 < 1) break;
    iVar2 = Vec_IntSize(pLVar3->vParts);
    if ((iVar2 == 2) &&
       (((iVar2 = Vec_IntEntry(pLVar3->vParts,0), iVar2 == pPart1->iPart &&
         (iVar2 = Vec_IntEntry(pLVar3->vParts,1), iVar2 == pPart2->iPart)) ||
        ((iVar2 = Vec_IntEntry(pLVar3->vParts,0), iVar2 == pPart2->iPart &&
         (iVar2 = Vec_IntEntry(pLVar3->vParts,1), iVar2 == pPart1->iPart)))))) {
      dd = p->dd;
      pDVar4 = Cudd_bddIthVar(p->dd,pLVar3->iVar);
      pDVar4 = Cudd_bddAnd(dd,bTemp,pDVar4);
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(p->dd,bTemp);
      bTemp = pDVar4;
    }
    TimeStop._4_4_ = TimeStop._4_4_ + 1;
  }
  __assert_fail("Vec_IntSize(pVar->vParts) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb3Image.c"
                ,0xb6,"DdNode *Llb_NonlinCreateCube2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
}

Assistant:

DdNode * Llb_NonlinCreateCube2( Llb_Mgr_t * p, Llb_Prt_t * pPart1, Llb_Prt_t * pPart2 )
{
    DdNode * bCube, * bTemp;
    Llb_Var_t * pVar;
    int i;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bCube = Cudd_ReadOne(p->dd);   Cudd_Ref( bCube );
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        assert( Vec_IntSize(pVar->vParts) > 0 );
        if ( Vec_IntSize(pVar->vParts) != 2 )
            continue;
        if ( (Vec_IntEntry(pVar->vParts, 0) == pPart1->iPart && Vec_IntEntry(pVar->vParts, 1) == pPart2->iPart) ||
             (Vec_IntEntry(pVar->vParts, 0) == pPart2->iPart && Vec_IntEntry(pVar->vParts, 1) == pPart1->iPart) )
        {
            bCube = Cudd_bddAnd( p->dd, bTemp = bCube, Cudd_bddIthVar(p->dd, pVar->iVar) );   Cudd_Ref( bCube );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }
    }
    Cudd_Deref( bCube );
    p->dd->TimeStop = TimeStop;
    return bCube;
}